

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O3

void do_oedit(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  PC_DATA *pPVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  OBJ_INDEX_DATA *pOVar6;
  DESCRIPTOR_DATA *pDVar7;
  AREA_DATA_conflict *pAVar8;
  char *pcVar9;
  char *pcVar10;
  char arg1 [4608];
  char local_1228 [4608];
  
  bVar3 = is_npc(ch);
  if (bVar3) {
    return;
  }
  bVar3 = check_security(ch);
  if (!bVar3) {
    return;
  }
  pcVar5 = one_argument(argument,local_1228);
  iVar4 = 0;
  if (local_1228[0] == '\0') {
    iVar1 = ch->pcdata->editing_item;
    iVar4 = 0;
    if (0 < iVar1) {
      iVar4 = iVar1;
    }
  }
  bVar3 = is_number(local_1228);
  if ((bVar3) || (iVar4 != 0)) {
    if (iVar4 == 0) {
      iVar4 = atoi(local_1228);
    }
    pOVar6 = get_obj_index(0);
    if (pOVar6 == (OBJ_INDEX_DATA *)0x0) {
      pcVar5 = "OEdit:  That vnum does not exist.\n\r";
      goto LAB_00354bde;
    }
    bVar3 = is_switched(ch);
    if (!bVar3) {
      pPVar2 = ch->pcdata;
      if (pPVar2->security <= pOVar6->area->security) {
        pcVar5 = pOVar6->area->builders;
        pcVar10 = strstr(pcVar5,ch->name);
        if ((pcVar10 == (char *)0x0) && (pcVar5 = strstr(pcVar5,"All"), pcVar5 == (char *)0x0))
        goto LAB_00354ba6;
      }
      pDVar7 = ch->desc;
      pDVar7->pEdit = pOVar6;
      pPVar2->editing_item = iVar4;
LAB_00354c5a:
      pDVar7->editor = 3;
      oedit_show(ch,"");
      return;
    }
  }
  else {
    bVar3 = str_cmp(local_1228,"create");
    if (bVar3) {
      pcVar5 = "OEdit:  There is no default object to edit.\n\r";
      goto LAB_00354bde;
    }
    iVar4 = atoi(pcVar5);
    if (iVar4 == 0 || *pcVar5 == '\0') {
      pcVar5 = "Syntax:  edit object create [vnum]\n\r";
      goto LAB_00354bde;
    }
    pAVar8 = get_vnum_area(iVar4);
    if (pAVar8 == (AREA_DATA_conflict *)0x0) {
      pcVar5 = "OEdit:  That vnum is not assigned an area.\n\r";
      goto LAB_00354bde;
    }
    bVar3 = is_switched(ch);
    if (!bVar3) {
      if (ch->pcdata->security <= pAVar8->security) {
        pcVar10 = pAVar8->builders;
        pcVar9 = strstr(pcVar10,ch->name);
        if ((pcVar9 == (char *)0x0) && (pcVar10 = strstr(pcVar10,"All"), pcVar10 == (char *)0x0))
        goto LAB_00354ba6;
      }
      bVar3 = oedit_create(ch,pcVar5);
      if (!bVar3) {
        return;
      }
      *(byte *)pAVar8->area_flags = (byte)pAVar8->area_flags[0] | 8;
      pDVar7 = ch->desc;
      goto LAB_00354c5a;
    }
  }
LAB_00354ba6:
  pcVar5 = "Insufficient security to modify object.\n\r";
LAB_00354bde:
  send_to_char(pcVar5,ch);
  return;
}

Assistant:

void do_oedit(CHAR_DATA *ch, char *argument)
{
	OBJ_INDEX_DATA *pObj;
	AREA_DATA *pArea;
	char arg1[MAX_STRING_LENGTH];
	int value = 0;

	if (is_npc(ch))
		return;

	if (!check_security(ch))
		return;

	argument = one_argument(argument, arg1);

	if (!strcmp(arg1, "") && ch->pcdata->editing_item > 0)
		value = ch->pcdata->editing_item;

	if (is_number(arg1) || value > 0)
	{
		if (value == 0)
			value = atoi(arg1);

		if (!(pObj = get_obj_index(value)))
		{
			send_to_char("OEdit:  That vnum does not exist.\n\r", ch);
			return;
		}

		if (!IS_BUILDER(ch, pObj->area))
		{
			send_to_char("Insufficient security to modify object.\n\r", ch);
			return;
		}

		ch->desc->pEdit = (void *)pObj;
		ch->pcdata->editing_item = value;
		ch->desc->editor = ED_OBJECT;

		oedit_show(ch, "");
		return;
	}
	else
	{
		if (!str_cmp(arg1, "create"))
		{
			value = atoi(argument);

			if (argument[0] == '\0' || value == 0)
			{
				send_to_char("Syntax:  edit object create [vnum]\n\r", ch);
				return;
			}

			pArea = get_vnum_area(value);

			if (!pArea)
			{
				send_to_char("OEdit:  That vnum is not assigned an area.\n\r", ch);
				return;
			}

			if (!IS_BUILDER(ch, pArea))
			{
				send_to_char("Insufficient security to modify object.\n\r", ch);
				return;
			}

			if (oedit_create(ch, argument))
			{
				SET_BIT(pArea->area_flags, AREA_CHANGED);
				ch->desc->editor = ED_OBJECT;
				oedit_show(ch, "");
			}

			return;
		}
	}

	send_to_char("OEdit:  There is no default object to edit.\n\r", ch);
}